

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mpi_miller_rabin(mbedtls_mpi *X,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t count_00;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  undefined1 local_d0 [8];
  mbedtls_mpi RR;
  mbedtls_mpi A;
  mbedtls_mpi T;
  mbedtls_mpi R;
  mbedtls_mpi W;
  size_t s;
  size_t n;
  size_t k;
  size_t j;
  size_t i;
  int count;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_mpi *X_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)&R.p);
  mbedtls_mpi_init((mbedtls_mpi *)&T.p);
  mbedtls_mpi_init((mbedtls_mpi *)&A.p);
  mbedtls_mpi_init((mbedtls_mpi *)&RR.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_d0);
  i._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)&R.p,X,1);
  if (i._4_4_ == 0) {
    count_00 = mbedtls_mpi_lsb((mbedtls_mpi *)&R.p);
    i._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&T.p,(mbedtls_mpi *)&R.p);
    if ((i._4_4_ == 0) &&
       (i._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&T.p,count_00), i._4_4_ == 0)) {
      sVar2 = mbedtls_mpi_bitlen(X);
      if (sVar2 < 0x514) {
        if (sVar2 < 0x352) {
          if (sVar2 < 0x28a) {
            if (sVar2 < 0x15e) {
              if (sVar2 < 0xfa) {
                local_e4 = 0x1b;
                if (0x95 < sVar2) {
                  local_e4 = 0x12;
                }
              }
              else {
                local_e4 = 0xc;
              }
              local_e0 = local_e4;
            }
            else {
              local_e0 = 8;
            }
            local_dc = local_e0;
          }
          else {
            local_dc = 4;
          }
          local_d8 = local_dc;
        }
        else {
          local_d8 = 3;
        }
        local_d4 = local_d8;
      }
      else {
        local_d4 = 2;
      }
      j = 0;
      do {
        if (((ulong)(long)local_d4 <= j) ||
           (i._4_4_ = mbedtls_mpi_fill_random((mbedtls_mpi *)&RR.p,X->n << 3,f_rng,p_rng),
           i._4_4_ != 0)) break;
        iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&R.p);
        if (-1 < iVar1) {
          sVar2 = mbedtls_mpi_bitlen((mbedtls_mpi *)&RR.p);
          sVar3 = mbedtls_mpi_bitlen((mbedtls_mpi *)&R.p);
          i._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&RR.p,(sVar2 - sVar3) + 1);
          if (i._4_4_ != 0) break;
        }
        *(ulong *)A.n = *(ulong *)A.n | 3;
        i._0_4_ = 0;
        do {
          i._4_4_ = mbedtls_mpi_fill_random((mbedtls_mpi *)&RR.p,X->n << 3,f_rng,p_rng);
          if (i._4_4_ != 0) goto LAB_001389a1;
          sVar2 = mbedtls_mpi_bitlen((mbedtls_mpi *)&RR.p);
          sVar3 = mbedtls_mpi_bitlen((mbedtls_mpi *)&R.p);
          if ((sVar3 < sVar2) &&
             (i._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&RR.p,sVar2 - sVar3), i._4_4_ != 0))
          goto LAB_001389a1;
          if (0x1e < (int)i) {
            return -0xe;
          }
          iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&R.p);
          bVar4 = true;
          if (iVar1 < 0) {
            iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&RR.p,1);
            bVar4 = iVar1 < 1;
          }
          i._0_4_ = (int)i + 1;
        } while (bVar4);
        i._4_4_ = mbedtls_mpi_exp_mod((mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&T.p,
                                      X,(mbedtls_mpi *)local_d0);
        if (i._4_4_ != 0) break;
        iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&R.p);
        if ((iVar1 != 0) && (iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&RR.p,1), iVar1 != 0)) {
          k = 1;
          while( true ) {
            bVar4 = false;
            if (k < count_00) {
              iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&R.p);
              bVar4 = iVar1 != 0;
            }
            if (!bVar4) break;
            i._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&A.p,(mbedtls_mpi *)&RR.p,
                                          (mbedtls_mpi *)&RR.p);
            if ((i._4_4_ != 0) ||
               (i._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&A.p,X),
               i._4_4_ != 0)) goto LAB_001389a1;
            iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&RR.p,1);
            if (iVar1 == 0) break;
            k = k + 1;
          }
          iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&RR.p,(mbedtls_mpi *)&R.p);
          if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&RR.p,1), iVar1 == 0)) {
            i._4_4_ = -0xe;
            break;
          }
        }
        j = j + 1;
      } while( true );
    }
  }
LAB_001389a1:
  mbedtls_mpi_free((mbedtls_mpi *)&R.p);
  mbedtls_mpi_free((mbedtls_mpi *)&T.p);
  mbedtls_mpi_free((mbedtls_mpi *)&A.p);
  mbedtls_mpi_free((mbedtls_mpi *)&RR.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_d0);
  return i._4_4_;
}

Assistant:

static int mpi_miller_rabin( const mbedtls_mpi *X,
                             int (*f_rng)(void *, unsigned char *, size_t),
                             void *p_rng )
{
    int ret, count;
    size_t i, j, k, n, s;
    mbedtls_mpi W, R, T, A, RR;

    mbedtls_mpi_init( &W ); mbedtls_mpi_init( &R ); mbedtls_mpi_init( &T ); mbedtls_mpi_init( &A );
    mbedtls_mpi_init( &RR );

    /*
     * W = |X| - 1
     * R = W >> lsb( W )
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &W, X, 1 ) );
    s = mbedtls_mpi_lsb( &W );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R, &W ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &R, s ) );

    i = mbedtls_mpi_bitlen( X );
    /*
     * HAC, table 4.4
     */
    n = ( ( i >= 1300 ) ?  2 : ( i >=  850 ) ?  3 :
          ( i >=  650 ) ?  4 : ( i >=  350 ) ?  8 :
          ( i >=  250 ) ? 12 : ( i >=  150 ) ? 18 : 27 );

    for( i = 0; i < n; i++ )
    {
        /*
         * pick a random A, 1 < A < |X| - 1
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &A, X->n * ciL, f_rng, p_rng ) );

        if( mbedtls_mpi_cmp_mpi( &A, &W ) >= 0 )
        {
            j = mbedtls_mpi_bitlen( &A ) - mbedtls_mpi_bitlen( &W );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &A, j + 1 ) );
        }
        A.p[0] |= 3;

        count = 0;
        do {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &A, X->n * ciL, f_rng, p_rng ) );

            j = mbedtls_mpi_bitlen( &A );
            k = mbedtls_mpi_bitlen( &W );
            if (j > k) {
                MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &A, j - k ) );
            }

            if (count++ > 30) {
                return MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            }

        } while ( mbedtls_mpi_cmp_mpi( &A, &W ) >= 0 ||
                  mbedtls_mpi_cmp_int( &A, 1 )  <= 0    );

        /*
         * A = A^R mod |X|
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &A, &A, &R, X, &RR ) );

        if( mbedtls_mpi_cmp_mpi( &A, &W ) == 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
            continue;

        j = 1;
        while( j < s && mbedtls_mpi_cmp_mpi( &A, &W ) != 0 )
        {
            /*
             * A = A * A mod |X|
             */
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &A, &A ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &A, &T, X  ) );

            if( mbedtls_mpi_cmp_int( &A, 1 ) == 0 )
                break;

            j++;
        }

        /*
         * not prime if A != |X| - 1 or A == 1
         */
        if( mbedtls_mpi_cmp_mpi( &A, &W ) != 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
        {
            ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            break;
        }
    }

cleanup:
    mbedtls_mpi_free( &W ); mbedtls_mpi_free( &R ); mbedtls_mpi_free( &T ); mbedtls_mpi_free( &A );
    mbedtls_mpi_free( &RR );

    return( ret );
}